

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O1

void __thiscall
trento::WoodsSaxonNucleus::WoodsSaxonNucleus
          (WoodsSaxonNucleus *this,size_t A,double R,double a,double dmin)

{
  piecewise_linear_distribution<double> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  iterator iVar3;
  size_t __k;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM3_Qb;
  double local_40;
  double local_38;
  
  (this->super_MinDistNucleus).super_Nucleus._vptr_Nucleus = (_func_int **)&PTR__Nucleus_001329a0;
  std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>::vector
            (&(this->super_MinDistNucleus).super_Nucleus.nucleons_,A,(allocator_type *)&local_40);
  (this->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
  (this->super_MinDistNucleus).dminsq_ = dmin * dmin;
  (this->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
       (_func_int **)&PTR__WoodsSaxonNucleus_00132a30;
  this->R_ = R;
  this->a_ = a;
  this_00 = &this->woods_saxon_dist_;
  this_01 = &(this->woods_saxon_dist_)._M_param._M_den;
  (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_m.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_m.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->woods_saxon_dist_)._M_param._M_m.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)this_00,0x3e9);
  std::vector<double,_std::allocator<double>_>::reserve(this_01,0x3e9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = R;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a;
  auVar1 = vfmadd132sd_fma(ZEXT816(0x4024000000000000),auVar8,auVar1);
  dVar5 = auVar1._0_8_ / 1000.0;
  lVar4 = 0;
  do {
    auVar7._0_8_ = (double)lVar4;
    auVar7._8_8_ = in_XMM3_Qb;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar5;
    auVar1 = vfmadd132sd_fma(auVar7,ZEXT816(0) << 0x40,auVar2);
    local_40 = auVar1._0_8_;
    iVar3._M_current =
         (this->woods_saxon_dist_)._M_param._M_int.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (this->woods_saxon_dist_)._M_param._M_int.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                ((vector<double,_std::allocator<double>_> *)this_00,iVar3,&local_40);
    }
    else {
      *iVar3._M_current = local_40;
      (this->woods_saxon_dist_)._M_param._M_int.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    dVar6 = dVar5 + (this->woods_saxon_dist_)._M_param._M_int.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar4];
    local_38 = dVar6 * dVar6;
    dVar6 = exp((dVar6 - R) / a);
    local_40 = local_38 / (dVar6 + 1.0);
    iVar3._M_current =
         (this->woods_saxon_dist_)._M_param._M_den.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (this->woods_saxon_dist_)._M_param._M_den.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (this_01,iVar3,&local_40);
    }
    else {
      *iVar3._M_current = local_40;
      (this->woods_saxon_dist_)._M_param._M_den.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x3e9);
  std::piecewise_linear_distribution<double>::param_type::_M_initialize(&this_00->_M_param);
  return;
}

Assistant:

WoodsSaxonNucleus::WoodsSaxonNucleus(
    std::size_t A, double R, double a, double dmin)
    : MinDistNucleus(A, dmin),
      R_(R),
      a_(a),
      woods_saxon_dist_(1000, 0., R + 10.*a,
        [R, a](double r) { return r*r/(1.+std::exp((r-R)/a)); })
{}